

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsgridlayout.cpp
# Opt level: O1

QSizeF __thiscall
QGraphicsGridLayout::sizeHint(QGraphicsGridLayout *this,SizeHint which,QSizeF *constraint)

{
  QGraphicsGridLayoutPrivate *this_00;
  long in_FS_OFFSET;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  QSizeF QVar5;
  qreal bottom;
  qreal right;
  qreal top;
  qreal left;
  undefined1 local_68 [16];
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QGraphicsGridLayoutPrivate *)
            (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d;
  local_40 = -NAN;
  local_48 = -NAN;
  local_50 = -NAN;
  local_58 = -NAN;
  (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[3])
            (this,&local_40,&local_48,&local_50,&local_58);
  dVar2 = local_50 + local_40;
  dVar4 = local_58 + local_48;
  local_68._0_8_ = constraint->wd - dVar2;
  local_68._8_8_ = constraint->ht - dVar4;
  dVar3 = dVar2;
  QGraphicsGridLayoutPrivate::styleInfo(this_00);
  dVar1 = (double)QGridLayoutEngine::sizeHint
                            ((int)this_00 + 0x118,(QSizeF *)(ulong)which,
                             (QAbstractLayoutStyleInfo *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar5.ht = dVar4 + dVar3;
    QVar5.wd = dVar2 + dVar1;
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QSizeF QGraphicsGridLayout::sizeHint(Qt::SizeHint which, const QSizeF &constraint) const
{
    Q_D(const QGraphicsGridLayout);
    qreal left, top, right, bottom;
    getContentsMargins(&left, &top, &right, &bottom);
    const QSizeF extraMargins(left + right, top + bottom);
    return d->engine.sizeHint(which , constraint - extraMargins, d->styleInfo()) + extraMargins;
}